

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

TestAllTypes_NestedMessage *
google::protobuf::DownCastMessage<proto2_unittest::TestAllTypes_NestedMessage>(MessageLite *from)

{
  TestAllTypes_NestedMessage *pTVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage local_28;
  Voidify local_11;
  TestAllTypes_NestedMessage *local_10;
  MessageLite *from_local;
  
  local_10 = (TestAllTypes_NestedMessage *)from;
  pTVar1 = DynamicCastMessage<proto2_unittest::TestAllTypes_NestedMessage>(from);
  if (pTVar1 == local_10) {
    return local_10;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
             ,0x595,"DynamicCastMessage<T>(from) == from");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [17])"Cannot downcast ");
  sVar3 = MessageLite::GetTypeName((MessageLite *)local_10);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])0x21377bd);
  pTVar1 = proto2_unittest::TestAllTypes_NestedMessage::default_instance();
  sVar3 = MessageLite::GetTypeName((MessageLite *)pTVar1);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}